

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O3

void testTiledRgba(string *tempDir)

{
  Rgba *pRVar1;
  pointer pcVar2;
  Compression comp;
  _Alloc_hider _Var3;
  bool bVar4;
  bool bVar5;
  ushort uVar6;
  int iVar7;
  Compression CVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long *plVar12;
  ostream *this;
  Rgba *pRVar13;
  ulong uVar14;
  LineOrder *pLVar15;
  Rgba *pRVar16;
  Box2i *pBVar17;
  half *phVar18;
  char *b;
  char *b_00;
  ChannelList *pCVar19;
  half *phVar20;
  short sVar21;
  int iVar22;
  int i;
  long lVar23;
  Rgba *pRVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  undefined1 in_R10B;
  int x_3;
  long lVar28;
  half *phVar29;
  int x_4;
  char *pcVar30;
  int tileY;
  ulong uVar31;
  int tileX;
  float fVar32;
  float fVar33;
  float fVar34;
  Rgba *local_160;
  string fileName;
  Header header;
  char *local_d8;
  string fileName_1;
  TiledRgbaOutputFile out;
  uif x_2;
  uif x_1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing the tiled RGBA image interface",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  bVar4 = IlmThread_2_5::supportsThreads();
  uVar11 = 0;
  while( true ) {
    bVar5 = IlmThread_2_5::supportsThreads();
    if (bVar5) {
      Imf_2_5::setGlobalThreadCount(uVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nnumber of threads: ",0x14);
      iVar7 = Imf_2_5::globalThreadCount();
      plVar12 = (long *)std::ostream::operator<<(&std::cout,iVar7);
      std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
      std::ostream::put((char)plVar12);
      std::ostream::flush();
    }
    lVar23 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nImage size = ",0xe);
      iVar7 = (&DAT_00228960)[lVar23];
      this = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(this," x ",3);
      iVar22 = (&DAT_00228970)[lVar23];
      plVar12 = (long *)std::ostream::operator<<(this,iVar22);
      std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
      std::ostream::put((char)plVar12);
      std::ostream::flush();
      CVar8 = NO_COMPRESSION;
      do {
        comp = CVar8;
        if (CVar8 == ZIP_COMPRESSION) {
          comp = PIZ_COMPRESSION;
        }
        if (lVar23 == 0) {
          anon_unknown.dwarf_2de879::writeRead
                    ((anon_unknown_dwarf_2de879 *)(tempDir->_M_dataplus)._M_p,
                     (string *)tempDir->_M_string_length,iVar7,iVar22,comp,1,1);
        }
        anon_unknown.dwarf_2de879::writeRead
                  ((anon_unknown_dwarf_2de879 *)(tempDir->_M_dataplus)._M_p,
                   (string *)tempDir->_M_string_length,iVar7,iVar22,comp,0x23,0x1a);
        anon_unknown.dwarf_2de879::writeRead
                  ((anon_unknown_dwarf_2de879 *)(tempDir->_M_dataplus)._M_p,
                   (string *)tempDir->_M_string_length,iVar7,iVar22,comp,0x4b,0x34);
        anon_unknown.dwarf_2de879::writeRead
                  ((anon_unknown_dwarf_2de879 *)(tempDir->_M_dataplus)._M_p,
                   (string *)tempDir->_M_string_length,iVar7,iVar22,comp,0x108,0x81);
        CVar8 = comp + RLE_COMPRESSION;
      } while ((int)comp < 9);
      lVar23 = lVar23 + 1;
    } while (lVar23 != 4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nfile with missing and broken tiles",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
    pcVar2 = (tempDir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fileName,pcVar2,pcVar2 + tempDir->_M_string_length);
    std::__cxx11::string::append((char *)&fileName);
    pRVar13 = (Rgba *)operator_new__(960000);
    uVar27 = 0;
    local_160 = pRVar13;
    do {
      uVar14 = uVar27 & 0xffffffff;
      iVar22 = (int)(uVar14 / 0x17) + (int)(uVar14 / 0x17) * -0x18 + (int)uVar27;
      fVar32 = (float)iVar22;
      iVar7 = (int)uVar27 + (int)(uVar14 / 0x1d) * -2 + (int)(uVar14 / 0x1d) * -0x1b;
      fVar33 = (float)iVar7;
      lVar23 = 0;
      do {
        uVar25 = (uint)lVar23 & 0xffff;
        sVar21 = (short)lVar23 + (short)(uVar25 / 5) * -5;
        fVar34 = (float)(int)sVar21;
        if (sVar21 == 0) {
          uVar9 = (uint)fVar34 >> 0x10;
        }
        else if (half::_eLut[(uint)fVar34 >> 0x17] == 0) {
          uVar6 = half::convert((int)fVar34);
          uVar9 = (uint)uVar6;
        }
        else {
          uVar9 = (uint)half::_eLut[(uint)fVar34 >> 0x17] +
                  (((uint)fVar34 & 0x7fffff) + 0xfff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >> 0xd
                  );
        }
        uVar25 = uVar25 / 0x11;
        sVar21 = (short)lVar23 - ((short)(uVar25 << 4) + (short)uVar25);
        fVar34 = (float)(int)sVar21;
        if (sVar21 == 0) {
          uVar25 = (uint)fVar34 >> 0x10;
        }
        else if (half::_eLut[(uint)fVar34 >> 0x17] == 0) {
          uVar6 = half::convert((int)fVar34);
          uVar25 = (uint)uVar6;
        }
        else {
          uVar25 = (uint)half::_eLut[(uint)fVar34 >> 0x17] +
                   (((uint)fVar34 & 0x7fffff) + 0xfff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >>
                   0xd);
        }
        uVar26 = (uint)fVar32 >> 0x10;
        if (iVar22 != 0) {
          if (half::_eLut[(uint)fVar32 >> 0x17] == 0) {
            uVar6 = half::convert((int)fVar32);
            uVar26 = (uint)uVar6;
          }
          else {
            uVar26 = (uint)half::_eLut[(uint)fVar32 >> 0x17] +
                     (((uint)fVar32 & 0x7fffff) + 0xfff + (uint)(((uint)fVar32 >> 0xd & 1) != 0) >>
                     0xd);
          }
        }
        uVar6 = (ushort)((uint)fVar33 >> 0x10);
        if (iVar7 != 0) {
          if (half::_eLut[(uint)fVar33 >> 0x17] == 0) {
            uVar6 = half::convert((int)fVar33);
          }
          else {
            uVar6 = half::_eLut[(uint)fVar33 >> 0x17] +
                    (short)(((uint)fVar33 & 0x7fffff) + 0xfff +
                            (uint)(((uint)fVar33 >> 0xd & 1) != 0) >> 0xd);
          }
        }
        local_160[lVar23] =
             (Rgba)((ulong)(uVar9 & 0xffff) |
                   (ulong)(uVar25 << 0x10) | (ulong)(uVar26 & 0xffff) << 0x20 | (ulong)uVar6 << 0x30
                   );
        lVar23 = lVar23 + 1;
      } while (lVar23 != 400);
      uVar27 = uVar27 + 1;
      local_160 = local_160 + 400;
    } while (uVar27 != 300);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    remove(fileName._M_dataplus._M_p);
    out._vptr_TiledRgbaOutputFile = (_func_int **)0x0;
    Imf_2_5::Header::Header(&header,400,300,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
    pLVar15 = Imf_2_5::Header::lineOrder(&header);
    _Var3 = fileName._M_dataplus;
    *pLVar15 = RANDOM_Y;
    iVar7 = Imf_2_5::globalThreadCount();
    Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
              (&out,_Var3._M_p,&header,WRITE_RGBA,0x1e,0x28,ONE_LEVEL,ROUND_DOWN,iVar7);
    Imf_2_5::TiledRgbaOutputFile::setFrameBuffer(&out,pRVar13,1,400);
    Imf_2_5::TiledRgbaOutputFile::writeTile(&out,0,0,0);
    for (iVar7 = 0; iVar22 = Imf_2_5::TiledRgbaOutputFile::numYTiles(&out,0), iVar7 < iVar22;
        iVar7 = iVar7 + 1) {
      for (iVar22 = 0; iVar10 = Imf_2_5::TiledRgbaOutputFile::numXTiles(&out,0), iVar22 < iVar10;
          iVar22 = iVar22 + 1) {
        if ((iVar7 + iVar22 & 1U) != 0) {
          Imf_2_5::TiledRgbaOutputFile::writeTile(&out,iVar22,iVar7,0);
        }
      }
    }
    Imf_2_5::TiledRgbaOutputFile::writeTile(&out,2,0,0);
    Imf_2_5::TiledRgbaOutputFile::breakTile(&out,0,0,0,0,0x19,10,-1);
    Imf_2_5::TiledRgbaOutputFile::breakTile(&out,2,0,0,0,0x19,10,-1);
    Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
    Imf_2_5::Header::~Header(&header);
    pRVar16 = (Rgba *)operator_new__(960000);
    lVar23 = 0;
    pRVar24 = pRVar16;
    do {
      lVar28 = 0;
      do {
        pRVar1 = pRVar24 + lVar28;
        pRVar1->r = 0xbc00;
        pRVar1->g = 0xbc00;
        pRVar1->b = 0xbc00;
        pRVar1->a = 0xbc00;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 400);
      lVar23 = lVar23 + 1;
      pRVar24 = pRVar24 + 400;
    } while (lVar23 != 300);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"reading one tile at a time,",0x1b);
    std::ostream::flush();
    _Var3 = fileName._M_dataplus;
    iVar7 = Imf_2_5::globalThreadCount();
    Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&header,_Var3._M_p,iVar7);
    pBVar17 = Imf_2_5::TiledRgbaInputFile::dataWindow((TiledRgbaInputFile *)&header);
    iVar7 = (pBVar17->min).x;
    if ((pBVar17->max).x - iVar7 != 399) {
      __assert_fail("dw.max.x - dw.min.x + 1 == width",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x217,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    iVar22 = (pBVar17->min).y;
    if ((pBVar17->max).y - iVar22 != 299) {
      __assert_fail("dw.max.y - dw.min.y + 1 == height",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x218,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (iVar7 != 0) {
      __assert_fail("dw.min.x == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x219,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (iVar22 != 0) {
      __assert_fail("dw.min.y == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x21a,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar16,1,400);
    for (iVar7 = 0; iVar22 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0)
        , iVar7 < iVar22; iVar7 = iVar7 + 1) {
      for (iVar22 = 0;
          iVar10 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0),
          iVar22 < iVar10; iVar22 = iVar22 + 1) {
        Imf_2_5::TiledRgbaInputFile::readTile((TiledRgbaInputFile *)&header,iVar22,iVar7,0);
        if ((iVar7 + iVar22 & 1U) != 1) {
          __assert_fail("tileBroken || (tilePresent == ((tileX + tileY) & 1))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                        ,0x232,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    std::ostream::flush();
    phVar18 = &pRVar16->a;
    phVar29 = &pRVar13->a;
    lVar23 = 0;
    phVar20 = phVar29;
    do {
      lVar28 = 0;
      do {
        fVar32 = half::_toFloat[phVar18[lVar28 * 4 + -3]._h].f;
        if ((((uint)lVar28 & 0xffff) / 0x1e + ((uint)lVar23 & 0xffff) / 0x28 & 1) == 0) {
          if ((((fVar32 != -1.0) || (NAN(fVar32))) ||
              (half::_toFloat[phVar18[lVar28 * 4 + -2]._h].f != -1.0)) ||
             (((NAN(half::_toFloat[phVar18[lVar28 * 4 + -2]._h].f) ||
               (half::_toFloat[phVar18[lVar28 * 4 + -1]._h].f != -1.0)) ||
              ((NAN(half::_toFloat[phVar18[lVar28 * 4 + -1]._h].f) ||
               ((half::_toFloat[phVar18[lVar28 * 4]._h].f != -1.0 ||
                (NAN(half::_toFloat[phVar18[lVar28 * 4]._h].f))))))))) {
            __assert_fail("t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x24f,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
        }
        else if (((((fVar32 != half::_toFloat[phVar20[lVar28 * 4 + -3]._h].f) ||
                   (NAN(fVar32) || NAN(half::_toFloat[phVar20[lVar28 * 4 + -3]._h].f))) ||
                  (half::_toFloat[phVar18[lVar28 * 4 + -2]._h].f !=
                   half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f)) ||
                 ((NAN(half::_toFloat[phVar18[lVar28 * 4 + -2]._h].f) ||
                   NAN(half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f) ||
                  (half::_toFloat[phVar18[lVar28 * 4 + -1]._h].f !=
                   half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f)))) ||
                ((NAN(half::_toFloat[phVar18[lVar28 * 4 + -1]._h].f) ||
                  NAN(half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f) ||
                 ((half::_toFloat[phVar18[lVar28 * 4]._h].f !=
                   half::_toFloat[phVar20[lVar28 * 4]._h].f ||
                  (NAN(half::_toFloat[phVar18[lVar28 * 4]._h].f) ||
                   NAN(half::_toFloat[phVar20[lVar28 * 4]._h].f))))))) {
          __assert_fail("t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                        ,0x248,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != 400);
      lVar23 = lVar23 + 1;
      phVar18 = phVar18 + 0x640;
      phVar20 = phVar20 + 0x640;
    } while (lVar23 != 300);
    Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    operator_delete__(pRVar16);
    pRVar16 = (Rgba *)operator_new__(960000);
    lVar23 = 0;
    pRVar24 = pRVar16;
    do {
      lVar28 = 0;
      do {
        pRVar1 = pRVar24 + lVar28;
        pRVar1->r = 0xbc00;
        pRVar1->g = 0xbc00;
        pRVar1->b = 0xbc00;
        pRVar1->a = 0xbc00;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 400);
      lVar23 = lVar23 + 1;
      pRVar24 = pRVar24 + 400;
    } while (lVar23 != 300);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"reading multiple tiles at a time,",0x21);
    std::ostream::flush();
    _Var3 = fileName._M_dataplus;
    iVar7 = Imf_2_5::globalThreadCount();
    Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&header,_Var3._M_p,iVar7);
    pBVar17 = Imf_2_5::TiledRgbaInputFile::dataWindow((TiledRgbaInputFile *)&header);
    iVar7 = (pBVar17->min).x;
    if ((pBVar17->max).x - iVar7 != 399) {
      __assert_fail("dw.max.x - dw.min.x + 1 == width",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x261,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    iVar22 = (pBVar17->min).y;
    if ((pBVar17->max).y - iVar22 != 299) {
      __assert_fail("dw.max.y - dw.min.y + 1 == height",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x262,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (iVar7 != 0) {
      __assert_fail("dw.min.x == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x263,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (iVar22 != 0) {
      __assert_fail("dw.min.y == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x264,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar16,1,400);
    iVar7 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
    if (0 < iVar7) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    std::ostream::flush();
    phVar20 = &pRVar16->a;
    lVar23 = 0;
    do {
      lVar28 = 0;
      do {
        fVar32 = half::_toFloat[phVar20[lVar28 * 4 + -3]._h].f;
        if (((((fVar32 != -1.0) || (NAN(fVar32))) ||
             (half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f != -1.0)) ||
            (((NAN(half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f) ||
              (half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f != -1.0)) ||
             ((NAN(half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f) ||
              ((half::_toFloat[phVar20[lVar28 * 4]._h].f != -1.0 ||
               (NAN(half::_toFloat[phVar20[lVar28 * 4]._h].f))))))))) &&
           (((fVar32 != half::_toFloat[phVar29[lVar28 * 4 + -3]._h].f ||
             ((((NAN(fVar32) || NAN(half::_toFloat[phVar29[lVar28 * 4 + -3]._h].f) ||
                (half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f !=
                 half::_toFloat[phVar29[lVar28 * 4 + -2]._h].f)) ||
               (NAN(half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f) ||
                NAN(half::_toFloat[phVar29[lVar28 * 4 + -2]._h].f))) ||
              ((half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f !=
                half::_toFloat[phVar29[lVar28 * 4 + -1]._h].f ||
               (NAN(half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f) ||
                NAN(half::_toFloat[phVar29[lVar28 * 4 + -1]._h].f))))))) ||
            ((half::_toFloat[phVar20[lVar28 * 4]._h].f != half::_toFloat[phVar29[lVar28 * 4]._h].f
             || (NAN(half::_toFloat[phVar20[lVar28 * 4]._h].f) ||
                 NAN(half::_toFloat[phVar29[lVar28 * 4]._h].f))))))) {
          __assert_fail("(t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1) || (t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                        ,0x287,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != 400);
      lVar23 = lVar23 + 1;
      phVar20 = phVar20 + 0x640;
      phVar29 = phVar29 + 0x640;
    } while (lVar23 != 300);
    Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    operator_delete__(pRVar16);
    remove(fileName._M_dataplus._M_p);
    operator_delete__(pRVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileName._M_dataplus._M_p != &fileName.field_2) {
      operator_delete(fileName._M_dataplus._M_p,
                      CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                               fileName.field_2._M_allocated_capacity._0_4_) + 1);
    }
    bVar5 = 2 < uVar11;
    uVar11 = uVar11 + 1;
    if (!bVar4 || bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nreading multi-layer file",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      fileName_1._M_dataplus._M_p = (pointer)&fileName_1.field_2;
      pcVar2 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fileName_1,pcVar2,pcVar2 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&fileName_1);
      b = (char *)operator_new__(0xdc56);
      b_00 = (char *)operator_new__(0xdc56);
      uVar27 = 0;
      pcVar30 = b_00;
      local_d8 = b;
      do {
        uVar31 = uVar27 & 0xffffffff;
        lVar23 = -0xed;
        uVar14 = 0;
        do {
          iVar22 = (int)(uVar31 / 0x17) + (int)(uVar31 / 0x17) * -0x18 + (int)uVar27 +
                   (int)(uVar14 / 0x11) * -0x11;
          iVar7 = (int)lVar23;
          fVar32 = (float)(iVar22 + iVar7 + 0xed);
          if (iVar22 + iVar7 == -0xed) {
            sVar21 = (short)((uint)fVar32 >> 0x10);
          }
          else if (half::_eLut[(uint)fVar32 >> 0x17] == 0) {
            sVar21 = half::convert((int)fVar32);
          }
          else {
            sVar21 = half::_eLut[(uint)fVar32 >> 0x17] +
                     (short)(((uint)fVar32 & 0x7fffff) + 0xfff +
                             (uint)(((uint)fVar32 >> 0xd & 1) != 0) >> 0xd);
          }
          iVar22 = (int)(uVar14 * 0xaf286bcb >> 0x20);
          iVar22 = (int)uVar27 + (int)(uVar31 / 0x1d) * -2 + (int)(uVar31 / 0x1d) * -0x1b +
                   (((uint)((int)uVar14 - iVar22) >> 1) + iVar22 >> 4) * -0x13;
          fVar32 = (float)(iVar22 + iVar7 + 0xed);
          *(short *)(local_d8 + lVar23 * 2 + 0x1da) = sVar21;
          if (iVar22 + iVar7 == -0xed) {
            sVar21 = (short)((uint)fVar32 >> 0x10);
          }
          else if (half::_eLut[(uint)fVar32 >> 0x17] == 0) {
            sVar21 = half::convert((int)fVar32);
          }
          else {
            sVar21 = half::_eLut[(uint)fVar32 >> 0x17] +
                     (short)(((uint)fVar32 & 0x7fffff) + 0xfff +
                             (uint)(((uint)fVar32 >> 0xd & 1) != 0) >> 0xd);
          }
          *(short *)(pcVar30 + lVar23 * 2 + 0x1da) = sVar21;
          uVar14 = (ulong)((int)uVar14 + 1);
          lVar23 = lVar23 + 1;
        } while (lVar23 != 0);
        uVar27 = uVar27 + 1;
        pcVar30 = pcVar30 + 0x1da;
        local_d8 = local_d8 + 0x1da;
      } while (uVar27 != 0x77);
      fileName._M_dataplus._M_p = (pointer)0x0;
      Imf_2_5::Header::Header
                (&header,0xed,0x77,1.0,(V2f *)&fileName,1.0,INCREASING_Y,ZIP_COMPRESSION);
      fileName._M_dataplus._M_p = (pointer)0x2000000020;
      fileName._M_string_length = 0;
      Imf_2_5::Header::setTileDescription(&header,(TileDescription *)&fileName);
      pCVar19 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar19,"R",(Channel *)&fileName);
      pCVar19 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar19,"foo.R",(Channel *)&fileName);
      out._outputFile._0_4_ = 0;
      out._toYa = (ToYa *)0x0;
      Imf_2_5::Slice::Slice((Slice *)&fileName,HALF,b,2,0x1da,1,1,0.0,(bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"R",(Slice *)&fileName);
      Imf_2_5::Slice::Slice((Slice *)&fileName,HALF,b_00,2,0x1da,1,1,0.0,(bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"foo.R",(Slice *)&fileName);
      _Var3 = fileName_1._M_dataplus;
      iVar7 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile
                ((TiledOutputFile *)&fileName,_Var3._M_p,&header,iVar7);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&fileName,(FrameBuffer *)&out);
      iVar7 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&fileName,0);
      iVar22 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&fileName,0);
      Imf_2_5::TiledOutputFile::writeTiles
                ((TiledOutputFile *)&fileName,0,iVar7 + -1,0,iVar22 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fileName);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      Imf_2_5::Header::~Header(&header);
      _Var3 = fileName_1._M_dataplus;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName._M_string_length = 0;
      fileName.field_2._M_allocated_capacity._0_4_ =
           fileName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      iVar7 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,_Var3._M_p,&fileName,iVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      pRVar13 = (Rgba *)operator_new__(0x37158);
      Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar13,1,0xed);
      iVar7 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
      iVar22 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      Imf_2_5::TiledRgbaInputFile::readTiles
                ((TiledRgbaInputFile *)&header,0,iVar7 + -1,0,iVar22 + -1,0);
      phVar20 = &pRVar13->a;
      lVar23 = 0;
      pcVar30 = b;
      do {
        lVar28 = 0;
        do {
          if ((half::_toFloat[phVar20[lVar28 * 4 + -3]._h].f !=
               half::_toFloat[*(ushort *)(pcVar30 + lVar28 * 2)].f) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4 + -3]._h].f) ||
              NAN(half::_toFloat[*(ushort *)(pcVar30 + lVar28 * 2)].f))) {
            __assert_fail("p3[y][x].r == p1[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2ca,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          if ((half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f != 0.0) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f))) {
            __assert_fail("p3[y][x].g == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2cb,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          if ((half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f != 0.0) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f))) {
            __assert_fail("p3[y][x].b == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2cc,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          if ((half::_toFloat[phVar20[lVar28 * 4]._h].f != 1.0) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4]._h].f))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2cd,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 0xed);
        lVar23 = lVar23 + 1;
        phVar20 = phVar20 + 0x3b4;
        pcVar30 = pcVar30 + 0x1da;
      } while (lVar23 != 0x77);
      operator_delete__(pRVar13);
      Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
      _Var3 = fileName_1._M_dataplus;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName.field_2._M_allocated_capacity._0_4_ = 0x6f6f66;
      fileName._M_string_length = 3;
      iVar7 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,_Var3._M_p,&fileName,iVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      pRVar13 = (Rgba *)operator_new__(0x37158);
      Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar13,1,0xed);
      iVar7 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
      iVar22 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      Imf_2_5::TiledRgbaInputFile::readTiles
                ((TiledRgbaInputFile *)&header,0,iVar7 + -1,0,iVar22 + -1,0);
      phVar20 = &pRVar13->a;
      lVar23 = 0;
      pcVar30 = b_00;
      do {
        lVar28 = 0;
        do {
          if ((half::_toFloat[phVar20[lVar28 * 4 + -3]._h].f !=
               half::_toFloat[*(ushort *)(pcVar30 + lVar28 * 2)].f) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4 + -3]._h].f) ||
              NAN(half::_toFloat[*(ushort *)(pcVar30 + lVar28 * 2)].f))) {
            __assert_fail("p3[y][x].r == p2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2dd,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          if ((half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f != 0.0) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f))) {
            __assert_fail("p3[y][x].g == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2de,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          if ((half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f != 0.0) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f))) {
            __assert_fail("p3[y][x].b == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2df,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          if ((half::_toFloat[phVar20[lVar28 * 4]._h].f != 1.0) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4]._h].f))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2e0,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 0xed);
        lVar23 = lVar23 + 1;
        phVar20 = phVar20 + 0x3b4;
        pcVar30 = pcVar30 + 0x1da;
      } while (lVar23 != 0x77);
      operator_delete__(pRVar13);
      Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
      _Var3 = fileName_1._M_dataplus;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName._M_string_length = 0;
      fileName.field_2._M_allocated_capacity._0_4_ =
           fileName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      iVar7 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,_Var3._M_p,&fileName,iVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      pRVar13 = (Rgba *)operator_new__(0x37158);
      Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar13,1,0xed);
      iVar7 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
      iVar22 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      Imf_2_5::TiledRgbaInputFile::readTiles
                ((TiledRgbaInputFile *)&header,0,iVar7 + -1,0,iVar22 / 2 + -1,0);
      fileName.field_2._M_allocated_capacity._0_4_ = 0x6f6f66;
      fileName._M_string_length = 3;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      Imf_2_5::TiledRgbaInputFile::setLayerName((TiledRgbaInputFile *)&header,&fileName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar13,1,0xed);
      iVar7 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
      iVar22 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      iVar10 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      Imf_2_5::TiledRgbaInputFile::readTiles
                ((TiledRgbaInputFile *)&header,0,iVar7 + -1,iVar22 / 2,iVar10 + -1,0);
      phVar20 = &pRVar13->a;
      lVar23 = 0;
      pcVar30 = b;
      local_d8 = b_00;
      do {
        lVar28 = 0;
        do {
          iVar7 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
          uVar11 = Imf_2_5::TiledRgbaInputFile::tileYSize((TiledRgbaInputFile *)&header);
          fVar32 = half::_toFloat[phVar20[lVar28 * 4 + -3]._h].f;
          if (lVar23 < (int)(uVar11 * (iVar7 / 2))) {
            if ((fVar32 != half::_toFloat[*(ushort *)(pcVar30 + lVar28 * 2)].f) ||
               (NAN(fVar32) || NAN(half::_toFloat[*(ushort *)(pcVar30 + lVar28 * 2)].f))) {
              __assert_fail("p3[y][x].r == p1[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                            ,0x2fb,
                            "void (anonymous namespace)::writeReadLayers(const std::string &)");
            }
          }
          else if ((fVar32 != half::_toFloat[*(ushort *)(local_d8 + lVar28 * 2)].f) ||
                  (NAN(fVar32) || NAN(half::_toFloat[*(ushort *)(local_d8 + lVar28 * 2)].f))) {
            __assert_fail("p3[y][x].r == p2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2fd,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          if ((half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f != 0.0) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f))) {
            __assert_fail("p3[y][x].g == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2ff,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          if ((half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f != 0.0) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f))) {
            __assert_fail("p3[y][x].b == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x300,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          if ((half::_toFloat[phVar20[lVar28 * 4]._h].f != 1.0) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4]._h].f))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x301,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 0xed);
        lVar23 = lVar23 + 1;
        pcVar30 = pcVar30 + 0x1da;
        phVar20 = phVar20 + 0x3b4;
        local_d8 = local_d8 + 0x1da;
      } while (lVar23 != 0x77);
      operator_delete__(pRVar13);
      Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
      fileName._M_dataplus._M_p = (pointer)0x0;
      Imf_2_5::Header::Header
                (&header,0xed,0x77,1.0,(V2f *)&fileName,1.0,INCREASING_Y,ZIP_COMPRESSION);
      fileName._M_dataplus._M_p = (pointer)0x2000000020;
      fileName._M_string_length = 0;
      Imf_2_5::Header::setTileDescription(&header,(TileDescription *)&fileName);
      pCVar19 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar19,"Y",(Channel *)&fileName);
      pCVar19 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar19,"foo.Y",(Channel *)&fileName);
      out._outputFile._0_4_ = 0;
      out._toYa = (ToYa *)0x0;
      Imf_2_5::Slice::Slice((Slice *)&fileName,HALF,b,2,0x1da,1,1,0.0,(bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"Y",(Slice *)&fileName);
      Imf_2_5::Slice::Slice((Slice *)&fileName,HALF,b_00,2,0x1da,1,1,0.0,(bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"foo.Y",(Slice *)&fileName);
      _Var3 = fileName_1._M_dataplus;
      iVar7 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile
                ((TiledOutputFile *)&fileName,_Var3._M_p,&header,iVar7);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&fileName,(FrameBuffer *)&out);
      iVar7 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&fileName,0);
      iVar22 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&fileName,0);
      Imf_2_5::TiledOutputFile::writeTiles
                ((TiledOutputFile *)&fileName,0,iVar7 + -1,0,iVar22 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fileName);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      Imf_2_5::Header::~Header(&header);
      _Var3 = fileName_1._M_dataplus;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName._M_string_length = 0;
      fileName.field_2._M_allocated_capacity._0_4_ =
           fileName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      iVar7 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,_Var3._M_p,&fileName,iVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      pRVar13 = (Rgba *)operator_new__(0x37158);
      Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar13,1,0xed);
      iVar7 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
      iVar22 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      Imf_2_5::TiledRgbaInputFile::readTiles
                ((TiledRgbaInputFile *)&header,0,iVar7 + -1,0,iVar22 + -1,0);
      phVar20 = &pRVar13->a;
      lVar23 = 0;
      pcVar30 = b;
      do {
        lVar28 = 0;
        do {
          fVar32 = half::_toFloat[*(ushort *)(pcVar30 + lVar28 * 2)].f;
          if ((half::_toFloat[phVar20[lVar28 * 4 + -3]._h].f != fVar32) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4 + -3]._h].f) || NAN(fVar32))) {
            __assert_fail("p3[y][x].r == p1[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x32a,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          if ((half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f != fVar32) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f) || NAN(fVar32))) {
            __assert_fail("p3[y][x].g == p1[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x32b,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          if ((half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f != fVar32) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f) || NAN(fVar32))) {
            __assert_fail("p3[y][x].b == p1[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x32c,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          if ((half::_toFloat[phVar20[lVar28 * 4]._h].f != 1.0) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4]._h].f))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x32d,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 0xed);
        lVar23 = lVar23 + 1;
        phVar20 = phVar20 + 0x3b4;
        pcVar30 = pcVar30 + 0x1da;
      } while (lVar23 != 0x77);
      operator_delete__(pRVar13);
      Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
      _Var3 = fileName_1._M_dataplus;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName.field_2._M_allocated_capacity._0_4_ = 0x6f6f66;
      fileName._M_string_length = 3;
      iVar7 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,_Var3._M_p,&fileName,iVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      pRVar13 = (Rgba *)operator_new__(0x37158);
      Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar13,1,0xed);
      iVar7 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
      iVar22 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      Imf_2_5::TiledRgbaInputFile::readTiles
                ((TiledRgbaInputFile *)&header,0,iVar7 + -1,0,iVar22 + -1,0);
      phVar20 = &pRVar13->a;
      lVar23 = 0;
      pcVar30 = b_00;
      do {
        lVar28 = 0;
        do {
          fVar32 = half::_toFloat[*(ushort *)(pcVar30 + lVar28 * 2)].f;
          if ((half::_toFloat[phVar20[lVar28 * 4 + -3]._h].f != fVar32) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4 + -3]._h].f) || NAN(fVar32))) {
            __assert_fail("p3[y][x].r == p2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x33d,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          if ((half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f != fVar32) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f) || NAN(fVar32))) {
            __assert_fail("p3[y][x].g == p2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x33e,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          if ((half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f != fVar32) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f) || NAN(fVar32))) {
            __assert_fail("p3[y][x].b == p2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x33f,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          if ((half::_toFloat[phVar20[lVar28 * 4]._h].f != 1.0) ||
             (NAN(half::_toFloat[phVar20[lVar28 * 4]._h].f))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x340,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 0xed);
        lVar23 = lVar23 + 1;
        phVar20 = phVar20 + 0x3b4;
        pcVar30 = pcVar30 + 0x1da;
        if (lVar23 == 0x77) {
          operator_delete__(pRVar13);
          Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
          _Var3 = fileName_1._M_dataplus;
          fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
          fileName._M_string_length = 0;
          fileName.field_2._M_allocated_capacity._0_4_ =
               fileName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
          iVar7 = Imf_2_5::globalThreadCount();
          Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                    ((TiledRgbaInputFile *)&header,_Var3._M_p,&fileName,iVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fileName._M_dataplus._M_p != &fileName.field_2) {
            operator_delete(fileName._M_dataplus._M_p,
                            CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                     fileName.field_2._M_allocated_capacity._0_4_) + 1);
          }
          pRVar13 = (Rgba *)operator_new__(0x37158);
          Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar13,1,0xed);
          iVar7 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
          iVar22 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
          Imf_2_5::TiledRgbaInputFile::readTiles
                    ((TiledRgbaInputFile *)&header,0,iVar7 + -1,0,iVar22 / 2 + -1,0);
          fileName.field_2._M_allocated_capacity._0_4_ = 0x6f6f66;
          fileName._M_string_length = 3;
          fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
          Imf_2_5::TiledRgbaInputFile::setLayerName((TiledRgbaInputFile *)&header,&fileName);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fileName._M_dataplus._M_p != &fileName.field_2) {
            operator_delete(fileName._M_dataplus._M_p,
                            CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                     fileName.field_2._M_allocated_capacity._0_4_) + 1);
          }
          Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar13,1,0xed);
          iVar7 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
          iVar22 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
          iVar10 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
          Imf_2_5::TiledRgbaInputFile::readTiles
                    ((TiledRgbaInputFile *)&header,0,iVar7 + -1,iVar22 / 2,iVar10 + -1,0);
          phVar20 = &pRVar13->a;
          lVar23 = 0;
          pcVar30 = b;
          local_d8 = b_00;
          do {
            lVar28 = 0;
            do {
              iVar7 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
              uVar11 = Imf_2_5::TiledRgbaInputFile::tileYSize((TiledRgbaInputFile *)&header);
              fVar32 = half::_toFloat[phVar20[lVar28 * 4 + -3]._h].f;
              if (lVar23 < (int)(uVar11 * (iVar7 / 2))) {
                fVar33 = half::_toFloat[*(ushort *)(pcVar30 + lVar28 * 2)].f;
                if ((fVar32 != fVar33) || (NAN(fVar32) || NAN(fVar33))) {
                  __assert_fail("p3[y][x].r == p1[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                ,0x35c,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
                if ((half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f != fVar33) ||
                   (NAN(half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f) || NAN(fVar33))) {
                  __assert_fail("p3[y][x].g == p1[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                ,0x35d,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
                if ((half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f != fVar33) ||
                   (NAN(half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f) || NAN(fVar33))) {
                  __assert_fail("p3[y][x].b == p1[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                ,0x35e,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
              }
              else {
                fVar33 = half::_toFloat[*(ushort *)(local_d8 + lVar28 * 2)].f;
                if ((fVar32 != fVar33) || (NAN(fVar32) || NAN(fVar33))) {
                  __assert_fail("p3[y][x].r == p2[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                ,0x362,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
                if ((half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f != fVar33) ||
                   (NAN(half::_toFloat[phVar20[lVar28 * 4 + -2]._h].f) || NAN(fVar33))) {
                  __assert_fail("p3[y][x].g == p2[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                ,0x363,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
                if ((half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f != fVar33) ||
                   (NAN(half::_toFloat[phVar20[lVar28 * 4 + -1]._h].f) || NAN(fVar33))) {
                  __assert_fail("p3[y][x].b == p2[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                ,0x364,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
              }
              if ((half::_toFloat[phVar20[lVar28 * 4]._h].f != 1.0) ||
                 (NAN(half::_toFloat[phVar20[lVar28 * 4]._h].f))) {
                __assert_fail("p3[y][x].a == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                              ,0x367,
                              "void (anonymous namespace)::writeReadLayers(const std::string &)");
              }
              lVar28 = lVar28 + 1;
            } while (lVar28 != 0xed);
            lVar23 = lVar23 + 1;
            phVar20 = phVar20 + 0x3b4;
            pcVar30 = pcVar30 + 0x1da;
            local_d8 = local_d8 + 0x1da;
            if (lVar23 == 0x77) {
              operator_delete__(pRVar13);
              Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
              remove(fileName_1._M_dataplus._M_p);
              operator_delete__(b_00);
              operator_delete__(b);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fileName_1._M_dataplus._M_p != &fileName_1.field_2) {
                operator_delete(fileName_1._M_dataplus._M_p,
                                fileName_1.field_2._M_allocated_capacity + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
              std::ostream::put('p');
              std::ostream::flush();
              return;
            }
          } while( true );
        }
      } while( true );
    }
  }
  iVar7 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
  Imf_2_5::TiledRgbaInputFile::readTiles((TiledRgbaInputFile *)&header,0,iVar7 + -1,0,0,0);
  __assert_fail("tilesMissing || tilesBroken",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                ,0x27a,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
}

Assistant:

void
testTiledRgba (const std::string &tempDir)
{
    try
    {
        cout << "Testing the tiled RGBA image interface" << endl;

	int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads()? 3: 0;

	for (int n = 0; n <= maxThreads; ++n)
	{
	    if (ILMTHREAD_NAMESPACE::supportsThreads())
	    {
		setGlobalThreadCount (n);
		cout << "\nnumber of threads: " << globalThreadCount() << endl;
	    }

	    const int W[] = { 9, 69, 75, 80 };
	    const int H[] = { 7, 50, 52, 55 };

	    for (int i = 0; i < 4; ++i)
	    {
		cout << "\nImage size = " << W[i] << " x " << H[i] << endl;

		for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
		{
		    //
		    // for tiled files, ZIPS and ZIP are the same thing
		    //

		    if (comp == ZIP_COMPRESSION)
			comp++;

		    if (i == 0)
		    {
			//
			// for single-pixel tiles, we don't gain anything
			// by testing multiple image sizes (and singe-pixel
			// tiles are rather slow anyway)
			//

			writeRead (tempDir, W[i], H[i], Compression (comp), 1, 1);
		    }

		    writeRead (tempDir, W[i], H[i], Compression (comp), 35, 26);
		    writeRead (tempDir, W[i], H[i], Compression (comp), 75, 52);
		    writeRead (tempDir, W[i], H[i], Compression (comp), 264, 129);
		}
	    }

	    writeReadIncomplete (tempDir);
	}

	writeReadLayers (tempDir);

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}